

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::elem<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  undefined1 *puVar2;
  _Uninitialized<wasm::Expression_*,_true> *p_Var3;
  long lVar4;
  _Uninitialized<wasm::Expression_*,_true> _Var5;
  size_t sVar6;
  pointer pAVar7;
  optional<wasm::Expression_*> offset;
  bool bVar8;
  undefined1 uVar9;
  __index_type *table_00;
  __index_type *__rhs;
  Name NVar10;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  MaybeResult<wasm::Name> table;
  undefined4 local_e7;
  undefined1 uStack_e4;
  undefined3 uStack_e3;
  undefined3 uStack_d7;
  char *local_d0;
  size_t local_c8;
  _Storage<wasm::Expression_*,_true> local_c0;
  undefined1 local_b0 [8];
  Result<wasm::Expression_*> _val_3;
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> elems;
  Result<wasm::Expression_*> _val_1;
  
  this = &ctx->in;
  sVar6 = (ctx->in).pos;
  expected._M_str = "elem";
  expected._M_len = 4;
  bVar8 = Lexer::takeSExprStart(this,expected);
  if (!bVar8) {
    (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x01';
    return __return_storage_ptr__;
  }
  table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = sVar6;
  Lexer::takeID((optional<wasm::Name> *)local_118,this);
  if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_ == '\0') {
    local_d0 = (char *)0x0;
    local_c8 = 0;
  }
  else {
    local_d0 = (char *)table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first
                       ._M_storage.super_IString.str._M_len;
    local_c8 = (size_t)local_118;
  }
  table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ = 1;
  expected_00._M_str = "declare";
  expected_00._M_len = 7;
  _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._39_1_ =
       Lexer::takeKeyword(this,expected_00);
  if ((bool)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._39_1_) {
LAB_00be6bd9:
    uVar9 = 0;
  }
  else {
    maybeTableuse<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<wasm::Name> *)
               &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,ctx);
    elems.val.
    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = local_118;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<wasm::Name,_wasm::None,_wasm::Err>_&>
      ::_S_vtable._M_arr
      [(long)(char)elems.val.
                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u.
                   _24_1_ + 1]._M_data)
              ((anon_class_8_1_8991fb9c_conflict13 *)
               &elems.val.
                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_index,
               (variant<wasm::Name,_wasm::None,_wasm::Err> *)
               &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                      &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                    &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,
                    (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_118);
    if (elems.val.
        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      puVar2 = (undefined1 *)
               ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u + 8);
      elems.val.
      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &elems.val.
                  super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                  .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_index,
                 _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,
                 elems.val.
                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._0_8_
                 + _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      if ((undefined1 *)
          elems.val.
          super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ == puVar2)
      {
        *puVar1 = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             elems.val.
             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10)
             = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                        _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::Expression_*,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
           (Expression *)
           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                        &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
      goto LAB_00be7190;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                      &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
    expected_01._M_str = "offset";
    expected_01._M_len = 6;
    bVar8 = Lexer::takeSExprStart(this,expected_01);
    if (!bVar8) {
      sVar6 = this->pos;
      bVar8 = Lexer::takeLParen(this);
      if (bVar8) {
        instr<wasm::WATParser::ParseDefsCtx>
                  ((MaybeResult<wasm::Ok> *)
                   &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,ctx);
        if (elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ !=
            '\x01') {
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          &elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           _M_index,
                          (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
          if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x02') {
            _Var5._M_storage =
                 (Expression *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u + 8);
            local_b0 = (undefined1  [8])_Var5._M_storage;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b0,
                       elems.val.
                       super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       _32_8_,(long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u
                                    ._M_first._M_storage +
                              elems.val.
                              super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                              .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                              ._32_8_);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                     0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            if (local_b0 == (undefined1  [8])_Var5._M_storage) {
              *puVar1 = _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
                   _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined1 (*) [8])
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10) =
                   _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
            }
            ((_Uninitialized<wasm::Expression_*,_true> *)
            ((long)&(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->
            _M_storage = (Expression *)
                         _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                         _M_storage;
            (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              &elems.val.
                               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               ._M_index);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              &elems.val.
                               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               ._M_index);
            ParseDefsCtx::makeExpr
                      ((Result<wasm::Expression_*> *)
                       &elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_index,ctx);
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_b0,
                            (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                            &elems.val.
                             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                             ._M_index);
            if (_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ != '\x01') {
              std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
              local_c0 = (_Storage<wasm::Expression_*,_true>)
                         elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         _32_8_;
              std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                                &elems.val.
                                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .
                                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 ._M_index);
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>.
                                 _M_index);
              goto LAB_00be6f8e;
            }
            local_178 = &local_168;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,local_b0,
                       (undefined1 *)
                       ((long)_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u.
                              _M_first._M_storage + (long)local_b0));
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                     0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            if (local_178 == &local_168) {
              *puVar1 = local_168;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
                   uStack_160;
            }
            else {
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_178;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10) =
                   local_168;
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8) =
                 local_170;
            (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                              &elems.val.
                               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               ._M_index);
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                            &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
          goto LAB_00be7190;
        }
        (ctx->in).pos = sVar6;
        pAVar7 = (ctx->in).annotations.
                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ctx->in).annotations.
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_finish != pAVar7) {
          (ctx->in).annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar7;
        }
        Lexer::skipSpace(this);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
      }
      goto LAB_00be6bd9;
    }
    expr<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::Expression_*> *)
               &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
               &elems.val.
                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_index,
               (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
               &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
    if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
      _Var5._M_storage =
           (Expression *)
           ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u + 8);
      local_b0 = (undefined1  [8])_Var5._M_storage;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,
                 elems.val.
                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_,
                 (long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                       _M_storage +
                 elems.val.
                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      if (local_b0 == (undefined1  [8])_Var5._M_storage) {
        *puVar1 = _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10) =
             _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
      }
      ((_Uninitialized<wasm::Expression_*,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
           (Expression *)
           _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        &elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         _M_index);
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
      goto LAB_00be7190;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                      &elems.val.
                       super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       _M_index);
    local_c0 = (_Storage<wasm::Expression_*,_true>)
               _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                      &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
LAB_00be6f8e:
    bVar8 = Lexer::takeRParen(this);
    uVar9 = 1;
    if (!bVar8) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"expected end of offset expression","");
      Lexer::err((Err *)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,this,
                 &local_158);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      lVar4 = (long)&elems.val.
                     super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u.
                     _M_rest + 8;
      if (_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ == lVar4) {
        *puVar1 = CONCAT71(elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           _M_u._9_7_,
                           elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           _M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             elems.val.
             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10)
             = CONCAT71(elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_u._9_7_,
                        elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8) =
           elems.val.
           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._0_8_;
      elems.val.
      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._0_8_ = 0;
      elems.val.
      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._M_first.
      _M_storage._M_storage[8] = '\0';
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = lVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00be7190;
    }
  }
  elemlist<wasm::WATParser::ParseDefsCtx>
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)
             &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,ctx,
             table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01');
  __rhs = &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     *)&elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_index,
                    (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     *)__rhs);
  if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    _Var5._M_storage =
         (Expression *)
         ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u + 8);
    local_b0 = (undefined1  [8])_Var5._M_storage;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,
               elems.val.
               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_,
               (long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                     _M_storage +
               elems.val.
               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_b0 == (undefined1  [8])_Var5._M_storage) {
      *puVar1 = _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
           _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10) =
           _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
    }
    ((_Uninitialized<wasm::Expression_*,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
         (Expression *)
         _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
    (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         *)&elems.val.
                            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                            ._M_index);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         *)&elems.val.
                            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                            ._M_index);
    bVar8 = Lexer::takeRParen(this);
    if (bVar8) {
      if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._39_1_ == '\0') {
        table_00 = local_118;
        if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
          table_00 = (__index_type *)0x0;
        }
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._13_3_ = uStack_e3;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_1_ = uStack_e4;
        uStack_d7 = (undefined3)local_e7;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._9_3_ = uStack_d7;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_engaged = (bool)uVar9;
        if (elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ !=
            '\0') {
          __rhs = (__index_type *)0x0;
        }
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload._M_value = local_c0._M_value;
        NVar10.super_IString.str._M_str = local_d0;
        NVar10.super_IString.str._M_len = local_c8;
        ParseDefsCtx::addElem
                  ((Result<wasm::Ok> *)
                   &elems.val.
                    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                    .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    _M_index,ctx,NVar10,(Name *)table_00,offset,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__rhs,
                   table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_4_);
        if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
          _Var5._M_storage =
               (Expression *)
               ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u + 8);
          local_b0 = (undefined1  [8])_Var5._M_storage;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,
                     elems.val.
                     super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                     super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_
                     ,(long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u.
                            _M_first._M_storage +
                      elems.val.
                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      _32_8_);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10
                   );
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          if (local_b0 == (undefined1  [8])_Var5._M_storage) {
            *puVar1 = _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
                 _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10) =
                 _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_8_;
          }
          ((_Uninitialized<wasm::Expression_*,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->
          _M_storage = (Expression *)
                       _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                       _M_storage;
          (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     &elems.val.
                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      _M_index);
          goto LAB_00be7187;
        }
      }
      else {
        _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &elems.val.
                  super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                  .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_index)
      ;
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
    }
    else {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"expected end of element segment","");
      Lexer::err((Err *)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         _M_index,this,&local_138);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      p_Var3 = &_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
      if ((_Uninitialized<wasm::Expression_*,_true> *)
          elems.val.
          super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ == p_Var3)
      {
        *puVar1 = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             elems.val.
             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10)
             = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                        _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::Expression_*,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
           (Expression *)
           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
           (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      elems.val.
      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00be7187:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       *)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
LAB_00be7190:
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_118);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> elem(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("elem"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  bool isDeclare = false;
  MaybeResult<typename Ctx::TableIdxT> table;
  std::optional<typename Ctx::ExprT> offset;

  if (ctx.in.takeKeyword("declare"sv)) {
    isDeclare = true;
  } else {
    table = maybeTableuse(ctx);
    CHECK_ERR(table);

    if (ctx.in.takeSExprStart("offset")) {
      auto off = expr(ctx);
      CHECK_ERR(off);
      offset = *off;
    } else {
      // This may be an abbreviated offset instruction or it may be the
      // beginning of the elemlist.
      auto beforeLParen = ctx.in.getPos();
      if (ctx.in.takeLParen()) {
        if (auto inst = instr(ctx)) {
          CHECK_ERR(inst);
          auto off = ctx.makeExpr();
          CHECK_ERR(off);
          offset = *off;
        } else {
          // This must be the beginning of the elemlist instead.
          ctx.in.setPos(beforeLParen);
        }
      }
    }
    if (offset && !ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
  }

  // If there is no explicit tableuse, we can use the legacy elemlist format.
  bool legacy = !table;
  auto elems = elemlist(ctx, legacy);
  CHECK_ERR(elems);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of element segment");
  }

  if (isDeclare) {
    CHECK_ERR(ctx.addDeclareElem(name, std::move(*elems), pos));
  } else {
    CHECK_ERR(
      ctx.addElem(name, table.getPtr(), offset, std::move(*elems), pos));
  }

  return Ok{};
}